

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

void vkt::SpirVAssembly::(anonymous_namespace)::fillRandomScalars<int,bool(*)(long)>
               (Random *rnd,int minValue,int maxValue,void *dst,int numValues,
               _func_bool_long *filter,int offset)

{
  bool bVar1;
  deInt32 dVar2;
  int local_40;
  int ndx;
  int value;
  int *typedPtr;
  _func_bool_long *filter_local;
  int numValues_local;
  void *dst_local;
  int maxValue_local;
  int minValue_local;
  Random *rnd_local;
  
  for (local_40 = 0; local_40 < numValues; local_40 = local_40 + 1) {
    do {
      dVar2 = randomScalar<int>(rnd,minValue,maxValue);
      bVar1 = (*filter)((long)dVar2);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    *(deInt32 *)((long)dst + (long)(offset + local_40) * 4) = dVar2;
  }
  return;
}

Assistant:

static void fillRandomScalars (de::Random& rnd, T minValue, T maxValue, void* dst, int numValues, FilterT filter, int offset = 0)
{
	T* const typedPtr = (T*)dst;
	T value;
	for (int ndx = 0; ndx < numValues; ndx++)
	{
		do
			value = randomScalar<T>(rnd, minValue, maxValue);
		while (!filter(value));

		typedPtr[offset + ndx] = value;
	}
}